

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.hpp
# Opt level: O0

Option * __thiscall
CLI::App::set_help_all_flag(App *this,string *help_name,string *help_description)

{
  bool bVar1;
  Option *this_00;
  long in_RDI;
  Option *unaff_retaddr;
  App *in_stack_00000008;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_00000010;
  string *in_stack_00000018;
  App *in_stack_00000020;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffd8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffe0;
  
  if (*(long *)(in_RDI + 0x178) != 0) {
    remove_option(in_stack_00000008,unaff_retaddr);
    *(undefined8 *)(in_RDI + 0x178) = 0;
  }
  bVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::empty
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x1e0dd7);
  if (!bVar1) {
    ::std::__cxx11::string::string(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
    this_00 = add_flag<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(CLI::detail::enabler)0>
                        (in_stack_00000020,in_stack_00000018,in_stack_00000010);
    *(Option **)(in_RDI + 0x178) = this_00;
    ::std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00);
    OptionBase<CLI::Option>::configurable(*(OptionBase<CLI::Option> **)(in_RDI + 0x178),false);
  }
  return *(Option **)(in_RDI + 0x178);
}

Assistant:

CLI11_INLINE Option *App::set_help_all_flag(std::string help_name, const std::string &help_description) {
    // take flag_description by const reference otherwise add_flag tries to assign to flag_description
    if(help_all_ptr_ != nullptr) {
        remove_option(help_all_ptr_);
        help_all_ptr_ = nullptr;
    }

    // Empty name will simply remove the help all flag
    if(!help_name.empty()) {
        help_all_ptr_ = add_flag(help_name, help_description);
        help_all_ptr_->configurable(false);
    }

    return help_all_ptr_;
}